

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Mio_DeriveGateDelays
               (Mio_Gate_t *pGate,float **ptPinDelays,int nPins,int nInputs,float tDelayZero,
               float *ptDelaysRes,float *ptPinDelayMax)

{
  Mio_Pin_t *pMVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  Mio_Pin_t **ppMVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  if (pGate->nInputs != nPins) {
    __assert_fail("pGate->nInputs == nPins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x425,
                  "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
                 );
  }
  uVar2 = 0;
  uVar4 = (ulong)(uint)nInputs;
  if (nInputs < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    ptDelaysRes[uVar2] = tDelayZero;
  }
  uVar2 = 0;
  fVar7 = 0.0;
  while( true ) {
    if (uVar2 == uVar4) {
      *ptPinDelayMax = fVar7;
      return;
    }
    lVar6 = 0;
    ppMVar5 = &pGate->pPins;
    while (pMVar1 = *ppMVar5, pMVar1 != (Mio_Pin_t *)0x0) {
      if ((0.0 <= ptPinDelays[lVar6][uVar2]) &&
         (fVar8 = ptPinDelays[lVar6][uVar2] + (float)pMVar1->dDelayBlockMax,
         ptDelaysRes[uVar2] <= fVar8 && fVar8 != ptDelaysRes[uVar2])) {
        ptDelaysRes[uVar2] = fVar8;
      }
      lVar6 = lVar6 + 1;
      ppMVar5 = &pMVar1->pNext;
    }
    if (nPins != (int)lVar6) break;
    fVar8 = ptDelaysRes[uVar2];
    if (ptDelaysRes[uVar2] <= fVar7) {
      fVar8 = fVar7;
    }
    fVar7 = fVar8;
    uVar2 = uVar2 + 1;
  }
  pcVar3 = Mio_GateReadName(pGate);
  printf("DEBUG: problem gate is %s\n",pcVar3);
  __assert_fail("k == nPins",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                ,0x439,
                "void Mio_DeriveGateDelays(Mio_Gate_t *, float **, int, int, float, float *, float *)"
               );
}

Assistant:

void Mio_DeriveGateDelays( Mio_Gate_t * pGate, 
    float ** ptPinDelays, int nPins, int nInputs, float tDelayZero, 
    float * ptDelaysRes, float * ptPinDelayMax )
{
    Mio_Pin_t * pPin;
    float Delay, DelayMax;
    int i, k;
    assert( pGate->nInputs == nPins );
    // set all the delays to the unused delay
    for ( i = 0; i < nInputs; i++ )
        ptDelaysRes[i] = tDelayZero;
    // compute the delays for each input and the max delay at the same time
    DelayMax = 0;
    for ( i = 0; i < nInputs; i++ )
    {
        for ( k = 0, pPin = pGate->pPins; pPin; pPin = pPin->pNext, k++ )
        {
            if ( ptPinDelays[k][i] < 0 )
                continue;
            Delay = ptPinDelays[k][i] + (float)pPin->dDelayBlockMax;
            if ( ptDelaysRes[i] < Delay )
                ptDelaysRes[i] = Delay;
        }
        if ( k != nPins )
        {
            printf ("DEBUG: problem gate is %s\n", Mio_GateReadName( pGate ));
        }
        assert( k == nPins );
        if ( DelayMax < ptDelaysRes[i] )
            DelayMax = ptDelaysRes[i];
    }
    *ptPinDelayMax = DelayMax;
}